

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexBindingStrideCase::test
          (VertexBindingStrideCase *this,ResultCollector *result)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  GLuint bindingindex;
  deUint32 dVar4;
  undefined4 extraout_var;
  int binding;
  int index;
  bool bVar5;
  allocator<char> local_169;
  ResultCollector *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  ScopedLogSection section_1;
  string local_d8;
  GLint reportedMaxBindings;
  CallLogWrapper gl;
  code *local_98;
  GLenum local_90;
  int local_84;
  VertexArray otherVao;
  Buffer buffer;
  VertexArray vao;
  
  local_168 = result;
  iVar2 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&buffer,((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx);
  reportedMaxBindings = -1;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glGetIntegerv(&gl,0x82da,&reportedMaxBindings);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Got Error ",(allocator<char> *)&local_98);
    otherVao.super_ObjectWrapper.m_gl = (Functions *)glu::getErrorName;
    otherVao.super_ObjectWrapper.m_traits._0_4_ = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&otherVao);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_100,&local_d8);
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_140,&local_160,"glGetIntegerv");
    tcu::ResultCollector::fail(local_168,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_100);
  }
  iVar2 = 0x10;
  if (0x10 < reportedMaxBindings) {
    iVar2 = reportedMaxBindings;
  }
  pTVar1 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"initial",(allocator<char> *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"Initial values",(allocator<char> *)&local_d8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  for (index = 0; iVar2 != index; index = index + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (local_168,&gl,0x82d8,index,0x10,(this->super_IndexedCase).m_verifier);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"vao",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"VAO state",(allocator<char> *)&local_100);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&otherVao,((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx);
  glu::CallLogWrapper::glBindVertexBuffer(&gl,1,buffer.super_ObjectWrapper.m_object,0,0x20);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Got Error ",&local_169)
    ;
    local_98 = glu::getErrorName;
    local_90 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_100,&local_d8);
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_140,&local_160,"glBindVertexBuffer");
    tcu::ResultCollector::fail(local_168,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_100);
  }
  glu::CallLogWrapper::glBindVertexArray(&gl,otherVao.super_ObjectWrapper.m_object);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Got Error ",&local_169)
    ;
    local_98 = glu::getErrorName;
    local_90 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_100,&local_d8);
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_140,&local_160,"glBindVertexArray");
    tcu::ResultCollector::fail(local_168,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_100);
  }
  glu::CallLogWrapper::glBindVertexBuffer(&gl,1,buffer.super_ObjectWrapper.m_object,0,0x40);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Got Error ",&local_169)
    ;
    local_98 = glu::getErrorName;
    local_90 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_100,&local_d8);
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_140,&local_160,"glBindVertexBuffer");
    tcu::ResultCollector::fail(local_168,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_100);
  }
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Got Error ",&local_169)
    ;
    local_98 = glu::getErrorName;
    local_90 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_100,&local_d8);
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_140,&local_160,"glBindVertexArray");
    tcu::ResultCollector::fail(local_168,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_100);
  }
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (local_168,&gl,0x82d8,1,0x20,(this->super_IndexedCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&otherVao.super_ObjectWrapper);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"random",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"Random values",(allocator<char> *)&local_100);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  deRandom_init((deRandom *)&otherVao,0xabc);
  local_84 = iVar2 + -1;
  iVar2 = 10;
  while( true ) {
    bVar5 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar5) break;
    bindingindex = de::Random::getInt((Random *)&otherVao,0,local_84);
    dVar4 = deRandom_getUint32((deRandom *)&otherVao);
    glu::CallLogWrapper::glBindVertexBuffer
              (&gl,bindingindex,buffer.super_ObjectWrapper.m_object,0,dVar4 % 0x801);
    GVar3 = glu::CallLogWrapper::glGetError(&gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Got Error ",&local_169);
      local_98 = glu::getErrorName;
      local_90 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     &local_100,&local_d8);
      std::operator+(&local_160,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     ": ");
      std::operator+(&local_140,&local_160,"glBindVertexBuffer");
      tcu::ResultCollector::fail(local_168,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_100);
    }
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (local_168,&gl,0x82d8,bindingindex,dVar4 % 0x801,(this->super_IndexedCase).m_verifier)
    ;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  glu::ObjectWrapper::~ObjectWrapper(&buffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return;
}

Assistant:

void VertexBindingStrideCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao					(m_context.getRenderContext());
	glu::Buffer			buffer				(m_context.getRenderContext());
	glw::GLint			reportedMaxBindings	= -1;
	glw::GLint			maxBindings;

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &reportedMaxBindings);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	maxBindings = de::max(16, reportedMaxBindings);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int binding = 0; binding < maxBindings; ++binding)
			verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_STRIDE, binding, 16, m_verifier);
	}

	// is part of vao
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "vao", "VAO state");
		glu::VertexArray			otherVao		(m_context.getRenderContext());

		// set to value A in vao1
		gl.glBindVertexBuffer(1, *buffer, 0, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// set to value B in vao2
		gl.glBindVertexArray(*otherVao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		gl.glBindVertexBuffer(1, *buffer, 0, 64);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// check value is still ok in original vao
		gl.glBindVertexArray(*vao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_STRIDE, 1, 32, m_verifier);
	}

	// random values
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "random", "Random values");
		de::Random					rnd				(0xabc);
		const int					numRandomTests	= 10;

		for (int randomTestNdx = 0; randomTestNdx < numRandomTests; ++randomTestNdx)
		{
			const int	binding			= rnd.getInt(0, maxBindings-1);
			const int	stride			= rnd.getInt(0, 2048);

			gl.glBindVertexBuffer(binding, *buffer, 0, stride);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

			verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_STRIDE, binding, stride, m_verifier);
		}
	}
}